

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Expr * nivalis::parse(Expr *__return_storage_ptr__,string *expr,Environment *env,bool mode_explicit,
                     bool quiet,size_t max_args,string *error_msg)

{
  allocator_type local_a1;
  ParseSession sess;
  
  if (expr->_M_string_length == 0) {
    Expr::Expr(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  if (((((error_msg == (string *)0x0) || (error_msg->_M_string_length == 0)) ||
       ((error_msg->_M_dataplus)._M_p[error_msg->_M_string_length - 1] == '\n')) ||
      (std::__cxx11::string::push_back((char)error_msg), expr->_M_string_length != 0)) &&
     (*(expr->_M_dataplus)._M_p == '#')) {
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
              ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)&sess,1,
               &local_a1);
    Expr::Expr(__return_storage_ptr__,(AST *)&sess);
    std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                  &sess);
    return __return_storage_ptr__;
  }
  ParseSession::ParseSession(&sess,expr,env,error_msg,mode_explicit,quiet,max_args);
  ParseSession::parse(__return_storage_ptr__,&sess);
  ParseSession::~ParseSession(&sess);
  return __return_storage_ptr__;
}

Assistant:

Expr parse(const std::string& expr, Environment& env,
        bool mode_explicit, bool quiet, size_t max_args,
       std::string* error_msg) {
    if (expr.empty()) return Expr();
    // If already error, add newline
    if (error_msg && error_msg->size() && error_msg->back() != '\n') error_msg->push_back('\n');
    if (expr.size() && expr[0] == '#') return Expr::AST(1); // Comment
    ParseSession sess(
            expr, env, error_msg, mode_explicit, quiet, max_args);
    return sess.parse();
}